

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_get_block_info(Integer g_a,Integer *num_blocks,Integer *block_dims)

{
  short sVar1;
  global_array_t *pgVar2;
  long lVar3;
  long lVar4;
  
  pgVar2 = GA;
  sVar1 = GA[g_a + 1000].ndim;
  if (GA[g_a + 1000].distr_type - 2U < 2) {
    if (0 < sVar1) {
      lVar4 = 0;
      do {
        num_blocks[lVar4] = pgVar2[g_a + 1000].num_blocks[lVar4];
        block_dims[lVar4] = pgVar2[g_a + 1000].block_dims[lVar4];
        lVar4 = lVar4 + 1;
      } while (sVar1 != lVar4);
    }
  }
  else {
    if (GA[g_a + 1000].distr_type == 4) {
      pnga_error("Don\'t know how to respond to get_block_infor for irregular tiled array",0);
      return;
    }
    if (0 < sVar1) {
      lVar4 = 0;
      do {
        lVar3 = pgVar2[g_a + 1000].block_dims[lVar4];
        if (lVar3 < 1) {
          lVar3 = 0;
        }
        else {
          lVar3 = (pgVar2[g_a + 1000].dims[lVar4] / lVar3 + 1) -
                  (ulong)(pgVar2[g_a + 1000].dims[lVar4] % lVar3 == 0);
        }
        num_blocks[lVar4] = lVar3;
        block_dims[lVar4] = pgVar2[g_a + 1000].block_dims[lVar4];
        lVar4 = lVar4 + 1;
      } while (sVar1 != lVar4);
    }
  }
  return;
}

Assistant:

void pnga_get_block_info(Integer g_a, Integer *num_blocks, Integer *block_dims)
{
  Integer ga_handle = GA_OFFSET + g_a;
  Integer i, ndim;
  ndim = GA[ga_handle].ndim; 
  if (GA[ga_handle].distr_type == SCALAPACK ||
      GA[ga_handle].distr_type == TILED) {
    for (i=0; i<ndim; i++) {
      num_blocks[i] = GA[ga_handle].num_blocks[i];
      block_dims[i] = GA[ga_handle].block_dims[i];
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    /* not sure what to do here */
    pnga_error("Don't know how to respond to get_block_infor for"
        " irregular tiled array",0);
  } else {
    Integer dim, bsize;
    for (i=0; i<ndim; i++) {
      dim = GA[ga_handle].dims[i];
      bsize = GA[ga_handle].block_dims[i];
      if (bsize > 0) {
        if (dim%bsize == 0) {
          num_blocks[i] = dim/bsize;
        } else {
          num_blocks[i] = dim/bsize+1;
        }
      } else {
        num_blocks[i] = 0;
      }
      block_dims[i] = GA[ga_handle].block_dims[i];
    }
  }
  return;
}